

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

int __thiscall CPU::instrASL0x0a(CPU *this)

{
  uint8_t uVar1;
  
  uVar1 = ASL(this,this->A);
  this->A = uVar1;
  return 2;
}

Assistant:

int CPU::instrASL0x0a() {
	A = ASL(A);
	return 2;
}